

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c
# Opt level: O1

void print_dma(int d,DMACNTH_t *cnth,uint wc,DMAINT_t *dmaint,uint sad,uint dad)

{
  ushort uVar1;
  undefined8 in_RAX;
  
  uVar1 = cnth->raw;
  DUI_Print("%d: enable: %d, start time: %d irq: %d sadctrl: %d dadctrl: %d",d,(ulong)(uVar1 >> 0xf)
            ,(ulong)(uVar1 >> 0xc & 3),(ulong)(uVar1 >> 0xe & 1),(ulong)(uVar1 >> 7 & 3),
            CONCAT44((int)((ulong)in_RAX >> 0x20),(uint)(uVar1 >> 5)) & 0xffffffff00000003);
  _duiCursor.y = _duiCursor.y + _duiStyle.LineHeight;
  _duiCursor.x = _duiLineStart;
  return;
}

Assistant:

void print_dma(int d, DMACNTH_t *cnth, unsigned int wc, DMAINT_t *dmaint, unsigned int sad, unsigned int dad) {
    DUI_Println("%d: enable: %d, start time: %d irq: %d sadctrl: %d dadctrl: %d",
                d,
                cnth->dma_enable,
                cnth->dma_start_time,
                cnth->irq_on_end_of_wc,
                cnth->source_addr_control,
                cnth->dest_addr_control);
}